

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O0

bool qt_closestItemFirst(QGraphicsItem *item1,QGraphicsItem *item2)

{
  QGraphicsItem *pQVar1;
  QGraphicsItemPrivate *pQVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItem *in_RSI;
  QGraphicsItem *in_RDI;
  bool bVar4;
  QGraphicsItem *p2;
  QGraphicsItem *p1;
  QGraphicsItem *t2;
  QGraphicsItem *t1;
  QGraphicsItem *p;
  int item2Depth;
  int item1Depth;
  QGraphicsItemPrivate *d2;
  QGraphicsItemPrivate *d1;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  QGraphicsItem *in_stack_ffffffffffffffb0;
  QGraphicsItem *item2_00;
  QGraphicsItem *in_stack_ffffffffffffffb8;
  QGraphicsItem *pQVar5;
  QGraphicsItem *local_40;
  QGraphicsItem *local_38;
  int local_30;
  int local_2c;
  bool local_1;
  
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                     (&in_RDI->d_ptr);
  pQVar3 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::data
                     (&in_RSI->d_ptr);
  if (pQVar2->parent == pQVar3->parent) {
    local_1 = qt_closestLeaf(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else {
    local_2c = QGraphicsItemPrivate::depth
                         ((QGraphicsItemPrivate *)
                          CONCAT17(in_stack_ffffffffffffffa7,
                                   CONCAT16(in_stack_ffffffffffffffa6,
                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                     in_stack_ffffffffffffffa0))));
    local_30 = QGraphicsItemPrivate::depth
                         ((QGraphicsItemPrivate *)
                          CONCAT17(in_stack_ffffffffffffffa7,
                                   CONCAT16(in_stack_ffffffffffffffa6,
                                            CONCAT15(in_stack_ffffffffffffffa5,
                                                     in_stack_ffffffffffffffa0))));
    local_38 = in_RDI;
    while( true ) {
      item2_00 = local_38;
      bVar4 = false;
      if (local_30 < local_2c) {
        pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&local_38->d_ptr);
        local_38 = pQVar2->parent;
        bVar4 = local_38 != (QGraphicsItem *)0x0;
      }
      pQVar5 = in_RSI;
      if (!bVar4) {
        while( true ) {
          local_38 = pQVar5;
          bVar4 = false;
          pQVar5 = local_38;
          if (local_2c < local_30) {
            pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&local_38->d_ptr);
            bVar4 = pQVar2->parent != (QGraphicsItem *)0x0;
            pQVar5 = local_38;
            local_38 = pQVar2->parent;
          }
          local_40 = item2_00;
          if (!bVar4) break;
          if (local_38 == in_RDI) {
            pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                     ::operator->(&pQVar5->d_ptr);
            return (*(ulong *)&pQVar2->field_0x160 & 0x10000000000) != 0;
          }
          local_30 = local_30 + -1;
          pQVar5 = local_38;
        }
        while (local_40 != (QGraphicsItem *)0x0 && local_40 != pQVar5) {
          pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&local_40->d_ptr);
          pQVar1 = pQVar2->parent;
          pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&pQVar5->d_ptr);
          item2_00 = local_40;
          local_40 = pQVar1;
          pQVar5 = pQVar2->parent;
        }
        bVar4 = qt_closestLeaf(pQVar5,item2_00);
        return bVar4;
      }
      if (local_38 == in_RSI) break;
      local_2c = local_2c + -1;
    }
    pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
             operator->(&item2_00->d_ptr);
    local_1 = (*(ulong *)&pQVar2->field_0x160 & 0x10000000000) == 0;
  }
  return local_1;
}

Assistant:

inline bool qt_closestItemFirst(const QGraphicsItem *item1, const QGraphicsItem *item2)
{
    // Siblings? Just check their z-values.
    const QGraphicsItemPrivate *d1 = item1->d_ptr.data();
    const QGraphicsItemPrivate *d2 = item2->d_ptr.data();
    if (d1->parent == d2->parent)
        return qt_closestLeaf(item1, item2);

    // Find common ancestor, and each item's ancestor closest to the common
    // ancestor.
    int item1Depth = d1->depth();
    int item2Depth = d2->depth();
    const QGraphicsItem *p = item1;
    const QGraphicsItem *t1 = item1;
    while (item1Depth > item2Depth && (p = p->d_ptr->parent)) {
        if (p == item2) {
            // item2 is one of item1's ancestors; item1 is on top
            return !(t1->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t1 = p;
        --item1Depth;
    }
    p = item2;
    const QGraphicsItem *t2 = item2;
    while (item2Depth > item1Depth && (p = p->d_ptr->parent)) {
        if (p == item1) {
            // item1 is one of item2's ancestors; item1 is not on top
            return (t2->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t2 = p;
        --item2Depth;
    }

    // item1Ancestor is now at the same level as item2Ancestor, but not the same.
    const QGraphicsItem *p1 = t1;
    const QGraphicsItem *p2 = t2;
    while (t1 && t1 != t2) {
        p1 = t1;
        p2 = t2;
        t1 = t1->d_ptr->parent;
        t2 = t2->d_ptr->parent;
    }

    // in case we have a common ancestor, we compare the immediate children in the ancestor's path.
    // otherwise we compare the respective items' topLevelItems directly.
    return qt_closestLeaf(p1, p2);
}